

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3ExprGlobalHitsCb(Fts3Expr *pExpr,int iPhrase,void *pCtx)

{
  u8 uVar1;
  u8 uVar2;
  undefined4 uVar3;
  Fts3Cursor *pCsr;
  sqlite3_vtab *pCtx_00;
  sqlite3_int64 sVar4;
  u32 *puVar5;
  Fts3Expr *pFVar6;
  Fts3Expr *pExpr_00;
  Fts3Expr *pFVar7;
  int iVar8;
  long lVar9;
  undefined4 *puVar10;
  long lVar11;
  long lVar12;
  long in_FS_OFFSET;
  int iPhrase_1;
  int local_40 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCsr = *pCtx;
  lVar11 = *(long *)((long)pCtx + 0x20);
  lVar9 = (long)(iPhrase * *(int *)((long)pCtx + 8) * 3);
  pCtx_00 = (pCsr->base).pVtab;
  if ((pExpr->bDeferred == '\0') || (pExpr->pParent->eType == 1)) {
    local_40[0] = 0;
    if (pExpr->aMI == (u32 *)0x0) {
      pFVar7 = pExpr->pParent;
      pExpr_00 = pExpr;
      while ((pFVar6 = pFVar7, pFVar6 != (Fts3Expr *)0x0 &&
             ((pFVar6->eType == 1 || (pExpr_00->bDeferred != '\0'))))) {
        pFVar7 = pFVar6->pParent;
        pExpr_00 = pFVar6;
      }
      sVar4 = pCsr->iPrevId;
      lVar12 = pExpr_00->iDocid;
      uVar1 = pExpr_00->bEof;
      local_40[1] = 0;
      local_40[0] = fts3ExprIterate2(pExpr_00,local_40 + 1,fts3AllocateMSI,pCtx_00);
      if (local_40[0] == 0) {
        fts3EvalRestart(pCsr,pExpr_00,local_40);
        if ((pCsr->isEof == '\0') && (local_40[0] == 0)) {
          do {
            do {
              if (pCsr->isRequireSeek == '\0') {
                sqlite3_reset(pCsr->pStmt);
              }
              fts3EvalNextRow(pCsr,pExpr_00,local_40);
              uVar2 = pExpr_00->bEof;
              pCsr->isEof = uVar2;
              pCsr->isRequireSeek = '\x01';
              pCsr->isMatchinfoNeeded = 1;
              pCsr->iPrevId = pExpr_00->iDocid;
            } while (((uVar2 == '\0') && (pExpr_00->eType == 1)) &&
                    (iVar8 = sqlite3Fts3EvalTestDeferred(pCsr,local_40), iVar8 != 0));
            if ((local_40[0] == 0) && (pCsr->isEof == '\0')) {
              fts3EvalUpdateCounts(pExpr_00,*(int *)&pCtx_00[2].pModule);
            }
          } while ((pCsr->isEof == '\0') && (local_40[0] == 0));
        }
        pCsr->isEof = '\0';
        pCsr->iPrevId = sVar4;
        if (uVar1 == '\0') {
          fts3EvalRestart(pCsr,pExpr_00,local_40);
          do {
            fts3EvalNextRow(pCsr,pExpr_00,local_40);
            if (pExpr_00->bEof != '\0') {
              local_40[0] = 0x10b;
            }
          } while ((pExpr_00->iDocid != lVar12) && (local_40[0] == 0));
        }
        else {
          pExpr_00->bEof = uVar1;
        }
      }
    }
    iVar8 = local_40[0];
    if (local_40[0] != 0) goto LAB_001d8b2f;
    if (0 < *(int *)&pCtx_00[2].pModule) {
      lVar11 = lVar11 + lVar9 * 4;
      puVar5 = pExpr->aMI;
      lVar9 = 8;
      iVar8 = 0;
      lVar12 = 0;
      do {
        *(undefined4 *)(lVar11 + -4 + lVar9) = *(undefined4 *)((long)puVar5 + lVar9 + -4);
        *(undefined4 *)(lVar11 + lVar9) = *(undefined4 *)((long)puVar5 + lVar9);
        lVar12 = lVar12 + 1;
        lVar9 = lVar9 + 0xc;
      } while (lVar12 < *(int *)&pCtx_00[2].pModule);
      goto LAB_001d8b2f;
    }
  }
  else if (0 < *(int *)&pCtx_00[2].pModule) {
    uVar3 = (undefined4)pCsr->nDoc;
    puVar10 = (undefined4 *)(lVar11 + lVar9 * 4 + 8);
    iVar8 = 0;
    lVar11 = 0;
    do {
      puVar10[-1] = uVar3;
      *puVar10 = uVar3;
      lVar11 = lVar11 + 1;
      puVar10 = puVar10 + 3;
    } while (lVar11 < *(int *)&pCtx_00[2].pModule);
    goto LAB_001d8b2f;
  }
  iVar8 = 0;
LAB_001d8b2f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar8;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3ExprGlobalHitsCb(
  Fts3Expr *pExpr,                /* Phrase expression node */
  int iPhrase,                    /* Phrase number (numbered from zero) */
  void *pCtx                      /* Pointer to MatchInfo structure */
){
  MatchInfo *p = (MatchInfo *)pCtx;
  return sqlite3Fts3EvalPhraseStats(
      p->pCursor, pExpr, &p->aMatchinfo[3*iPhrase*p->nCol]
  );
}